

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O3

int ly_utf8_and_equal(char *input,int bytes,...)

{
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint local_d8;
  uint local_b8 [14];
  va_list ap;
  
  puVar4 = (uint *)&stack0x00000008;
  if (0 < bytes) {
    local_d8 = 0x10;
    uVar2 = 0;
    do {
      if (local_d8 < 0x29) {
        uVar1 = local_d8 + 8;
        uVar5 = *(uint *)((long)local_b8 + (ulong)local_d8);
        puVar3 = puVar4;
        if (0x20 < local_d8) goto LAB_0010f092;
        puVar3 = (uint *)((long)local_b8 + (ulong)uVar1);
        local_d8 = local_d8 + 0x10;
      }
      else {
        uVar5 = *puVar4;
        puVar3 = puVar4 + 2;
        uVar1 = local_d8;
LAB_0010f092:
        puVar4 = puVar3 + 2;
        local_d8 = uVar1;
      }
      if (((byte)input[uVar2] & uVar5) != (uint)(byte)*puVar3) {
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)bytes != uVar2);
  }
  return 1;
}

Assistant:

static int
ly_utf8_and_equal(const char *input, int bytes, ...)
{
    va_list ap;
    int i, and, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        and = va_arg(ap, int);
        byte = va_arg(ap, int);

        /* compare each byte */
        if (((uint8_t)input[i] & and) != (uint8_t)byte) {
            return 0;
        }
    }
    va_end(ap);

    return 1;
}